

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O2

void __thiscall GCPtr<symbols::RangeObject>::~GCPtr(GCPtr<symbols::RangeObject> *this)

{
  iterator iVar1;
  
  iVar1 = findPtrInfo(this,this->addr);
  if (*(int *)&iVar1._M_node[1]._M_next != 0) {
    *(int *)&iVar1._M_node[1]._M_next = *(int *)&iVar1._M_node[1]._M_next + -1;
  }
  if (gcthreshold <=
      (int)gclist_abi_cxx11_.
           super__List_base<GCInfo<symbols::RangeObject>,_std::allocator<GCInfo<symbols::RangeObject>_>_>
           ._M_impl._M_node._M_size) {
    collect();
  }
  return;
}

Assistant:

GCPtr<T>::~GCPtr(){

    typename list<GCInfo<T>>::iterator p;

    p = findPtrInfo(addr);
    if(p->refcount) p->refcount--;
    #ifdef DISPLAY
        cout << "GCPtr going out of scope.\n";
    #endif
    // Collect garbage when a number of pointers that have gone out of scope
    // reaches gcthreshold
    if(gclistSize() >= gcthreshold)
        collect();
}